

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIStaticText.cpp
# Opt level: O3

s32 __thiscall irr::gui::CGUIStaticText::getTextHeight(CGUIStaticText *this)

{
  int iVar1;
  long *plVar2;
  int extraout_var;
  int extraout_var_00;
  
  plVar2 = (long *)(**(code **)(*(long *)this + 0x130))();
  if (plVar2 == (long *)0x0) {
    iVar1 = 0;
  }
  else if (this->WordWrap == true) {
    (**(code **)(*plVar2 + 8))(plVar2,L"A");
    iVar1 = (**(code **)(*plVar2 + 0x38))(plVar2);
    iVar1 = (int)((ulong)((long)(this->BrokenText).m_data.
                                super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->BrokenText).m_data.
                               super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5) *
            (iVar1 + extraout_var);
  }
  else {
    (**(code **)(*plVar2 + 8))(plVar2,*(undefined8 *)&this->field_0xa8);
    iVar1 = extraout_var_00;
  }
  return iVar1;
}

Assistant:

s32 CGUIStaticText::getTextHeight() const
{
	IGUIFont *font = getActiveFont();
	if (!font)
		return 0;

	if (WordWrap) {
		s32 height = font->getDimension(L"A").Height + font->getKerningHeight();
		return height * BrokenText.size();
	} else {
		// TODO: Text can have multiple lines which are not in BrokenText
		// This is likely not correct. But as I have no time for further
		// investigation I just fix it for now by return the true height here.
		return font->getDimension(Text.c_str()).Height;
	}
}